

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::CompositeReferences
               (AssetResolutionResolver *resolver,Layer *in_layer,Layer *composited_layer,
               string *warn,string *err,ReferencesCompositionOptions *options)

{
  bool bVar1;
  ostream *poVar2;
  __node_base *p_Var3;
  bool bVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  ostringstream ss_e;
  Layer dst;
  ReferencesCompositionOptions *in_stack_ffffffffffffe810;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17d8 [2];
  ostringstream local_17a0 [376];
  Layer local_1628;
  
  if (composited_layer == (Layer *)0x0) {
    bVar4 = false;
  }
  else {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_17d8,&in_layer->_asset_search_paths);
    Layer::Layer(&local_1628,in_layer);
    p_Var3 = &local_1628._prim_specs._M_h._M_before_begin;
    do {
      p_Var3 = p_Var3->_M_nxt;
      bVar4 = p_Var3 == (__node_base *)0x0;
      if (bVar4) {
        Layer::operator=(composited_layer,&local_1628);
        goto LAB_0017171d;
      }
      bVar1 = anon_unknown_160::CompositeReferencesRec
                        (0,resolver,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_layer,(Layer *)(p_Var3 + 5),(PrimSpec *)warn,err,(string *)options,
                         in_stack_ffffffffffffe810);
    } while (bVar1);
    ::std::__cxx11::ostringstream::ostringstream(local_17a0);
    poVar2 = ::std::operator<<((ostream *)local_17a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"CompositeReferences");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x40e);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_17a0,"Composite `references` failed.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_17a0);
LAB_0017171d:
    Layer::~Layer(&local_1628);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_17d8);
  }
  return bVar4;
}

Assistant:

bool CompositeReferences(AssetResolutionResolver &resolver,
                         const Layer &in_layer, Layer *composited_layer,
                         std::string *warn, std::string *err,
                         ReferencesCompositionOptions options) {
  if (!composited_layer) {
    return false;
  }

  std::vector<std::string> search_paths = in_layer.get_asset_search_paths();

  Layer dst = in_layer;  // deep copy

  for (auto &item : dst.primspecs()) {
    if (!CompositeReferencesRec(/* depth */ 0, resolver, search_paths, in_layer,
                                item.second, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Composite `references` failed.");
    }
  }

  (*composited_layer) = dst;

  DCOUT("Composite `references` ok.");
  return true;
}